

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
~basic_json_encoder(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                    *this)

{
  stream_sink<char>::flush(&this->sink_);
  std::__cxx11::string::~string((string *)&this->close_array_bracket_str_);
  std::__cxx11::string::~string((string *)&this->open_array_bracket_str_);
  std::__cxx11::string::~string((string *)&this->close_object_brace_str_);
  std::__cxx11::string::~string((string *)&this->open_object_brace_str_);
  std::__cxx11::string::~string((string *)&this->comma_str_);
  std::__cxx11::string::~string((string *)&this->colon_str_);
  std::
  _Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  ::~_Vector_base(&(this->stack_).
                   super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                 );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&this->fp_);
  basic_json_encode_options<char>::~basic_json_encode_options(&this->options_);
  stream_sink<char>::~stream_sink(&this->sink_);
  return;
}

Assistant:

~basic_json_encoder() noexcept
        {
            JSONCONS_TRY
            {
                sink_.flush();
            }